

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int StopThreadSSC32x(SSC32 *pSSC32)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = SSC32CS;
  lVar1 = 0;
  do {
    if (*(SSC32 **)((long)addrsSSC32 + lVar1 * 2) == pSSC32) {
      *(undefined4 *)((long)bExitSSC32 + lVar1) = 1;
      pthread_join(*(pthread_t *)((long)SSC32ThreadId + lVar1 * 2),(void **)0x0);
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resSSC32 + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadSSC32x(SSC32* pSSC32)
{
	int id = 0;

	while (addrsSSC32[id] != pSSC32)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitSSC32[id] = TRUE;
	WaitForThread(SSC32ThreadId[id]);
	DeleteCriticalSection(&SSC32CS[id]);
	resSSC32[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}